

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool storage::cc(int *arr,int cnt)

{
  int local_28;
  int i;
  bool ret;
  int cur;
  int cnt_local;
  int *arr_local;
  
  i = *arr;
  local_28 = 1;
  while( true ) {
    if (cnt <= local_28) {
      return true;
    }
    if (arr[local_28] <= i) break;
    i = arr[local_28];
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool cc(int *arr, int cnt) {
        int cur = arr[0];
        bool ret = true;
        for (int i = 1; i < cnt; ++i) {
            if (arr[i] > cur)
                cur = arr[i];
            else
                return false;
        }
        return ret;
    }